

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O0

Orphan<capnproto_test::capnp::test::TestDefaults> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnproto_test::capnp::test::TestDefaults>
          (Orphan<capnproto_test::capnp::test::TestDefaults> *__return_storage_ptr__,
          Orphan<capnp::DynamicValue> *this)

{
  OrphanBuilder *builder;
  BuilderFor<capnproto_test::capnp::test::TestDefaults> local_80;
  Builder local_58;
  Orphan<capnp::DynamicValue> *local_18;
  Orphan<capnp::DynamicValue> *this_local;
  
  local_18 = this;
  this_local = (Orphan<capnp::DynamicValue> *)__return_storage_ptr__;
  get(&local_58,this);
  DynamicValue::Builder::as<capnproto_test::capnp::test::TestDefaults>(&local_80,&local_58);
  DynamicValue::Builder::~Builder(&local_58);
  this->type = UNKNOWN;
  builder = kj::mv<capnp::_::OrphanBuilder>(&this->builder);
  Orphan<capnproto_test::capnp::test::TestDefaults>::Orphan(__return_storage_ptr__,builder);
  return __return_storage_ptr__;
}

Assistant:

Orphan<T> Orphan<DynamicValue>::releaseAs() {
  get().as<T>();  // type check
  type = DynamicValue::UNKNOWN;
  return Orphan<T>(kj::mv(builder));
}